

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderInvarianceRule6Test::initTestIterations
          (TessellationShaderInvarianceRule6Test *this)

{
  GLfloat primitive_mode_00;
  GLfloat GVar1;
  bool bVar2;
  int iVar3;
  deUint32 err;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  size_type sVar5;
  reference pvVar6;
  undefined1 local_dc [8];
  _test_iteration test;
  _tessellation_levels *levels;
  __normal_iterator<glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
  local_a8;
  __normal_iterator<const_glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
  local_a0;
  _tessellation_levels_set_const_iterator set_iterator;
  uint n_levels_set;
  _tessellation_levels_set local_88;
  int local_6c;
  undefined1 local_68 [4];
  uint n_levels_sets;
  _tessellation_levels_set levels_set;
  float *inner_levels_to_use;
  uint local_40;
  _tessellation_shader_vertex_ordering vertex_ordering;
  uint n_vo_mode;
  _tessellation_primitive_mode primitive_mode;
  uint n_primitive_mode;
  uint n_vo_modes;
  uint n_primitive_modes;
  _tessellation_shader_vertex_ordering vertex_ordering_modes [2];
  _tessellation_primitive_mode primitive_modes [2];
  GLint gl_max_tess_gen_level_value;
  Functions *gl;
  TessellationShaderInvarianceRule6Test *this_local;
  
  pRVar4 = deqp::Context::getRenderContext
                     ((this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.
                      m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  register0x00000000 = CONCAT44(extraout_var,iVar3);
  primitive_modes[0] = TESSELLATION_SHADER_PRIMITIVE_MODE_FIRST;
  (**(code **)(register0x00000000 + 0x868))
            ((this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.m_glExtTokens.
             MAX_TESS_GEN_LEVEL,primitive_modes);
  err = (**(code **)(stack0xffffffffffffffe8 + 0x800))();
  glu::checkError(err,"glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                  ,0x91a);
  vertex_ordering_modes[0] = TESSELLATION_SHADER_VERTEX_ORDERING_CW;
  vertex_ordering_modes[1] = TESSELLATION_SHADER_VERTEX_ORDERING_DEFAULT;
  _n_vo_modes = 0x100000000;
  for (n_vo_mode = 0; n_vo_mode < 2; n_vo_mode = n_vo_mode + 1) {
    primitive_mode_00 = (GLfloat)vertex_ordering_modes[n_vo_mode];
    for (local_40 = 0; local_40 < 2; local_40 = local_40 + 1) {
      GVar1 = (GLfloat)(&n_vo_modes)[local_40];
      levels_set.
      super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::vector
                ((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                  *)local_68);
      local_6c = 0;
      TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode
                (&local_88,(_tessellation_primitive_mode)primitive_mode_00,primitive_modes[0],
                 TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);
      std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
      operator=((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_> *
                )local_68,&local_88);
      std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
      ~vector(&local_88);
      sVar5 = std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
              ::size((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                      *)local_68);
      local_6c = (int)sVar5;
      levels_set.
      super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
           operator[]((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                       *)local_68,(ulong)(local_6c - 1));
      for (set_iterator._M_current._0_4_ = 0; (uint)set_iterator._M_current < local_6c - 1U;
          set_iterator._M_current._0_4_ = (uint)set_iterator._M_current + 1) {
        pvVar6 = std::
                 vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
                 operator[]((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                             *)local_68,(ulong)(uint)set_iterator._M_current);
        *(undefined8 *)pvVar6->inner =
             *(undefined8 *)
              (levels_set.
               super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage)->inner;
      }
      local_a8._M_current =
           (_tessellation_levels *)
           std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
           begin((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                  *)local_68);
      __gnu_cxx::
      __normal_iterator<glcts::_tessellation_levels_const*,std::vector<glcts::_tessellation_levels,std::allocator<glcts::_tessellation_levels>>>
      ::__normal_iterator<glcts::_tessellation_levels*>
                ((__normal_iterator<glcts::_tessellation_levels_const*,std::vector<glcts::_tessellation_levels,std::allocator<glcts::_tessellation_levels>>>
                  *)&local_a0,&local_a8);
      while( true ) {
        levels = (_tessellation_levels *)
                 std::
                 vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
                 end((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                      *)local_68);
        bVar2 = __gnu_cxx::operator!=
                          (&local_a0,
                           (__normal_iterator<glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
                            *)&levels);
        if (!bVar2) break;
        test._28_8_ = __gnu_cxx::
                      __normal_iterator<const_glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
                      ::operator*(&local_a0);
        _test_iteration::_test_iteration((_test_iteration *)local_dc);
        local_dc = *(undefined1 (*) [8])test._28_8_;
        test.inner_tess_levels = *(GLfloat (*) [2])(test._28_8_ + 8);
        test.outer_tess_levels._0_8_ = *(undefined8 *)(test._28_8_ + 0x10);
        test.outer_tess_levels[2] = primitive_mode_00;
        test.outer_tess_levels[3] = GVar1;
        if (primitive_mode_00 == 1.4013e-45) {
          std::
          vector<glcts::TessellationShaderInvarianceRule6Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule6Test::_test_iteration>_>
          ::push_back(&this->m_test_triangles_iterations,(value_type *)local_dc);
        }
        else {
          std::
          vector<glcts::TessellationShaderInvarianceRule6Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule6Test::_test_iteration>_>
          ::push_back(&this->m_test_quads_iterations,(value_type *)local_dc);
        }
        __gnu_cxx::
        __normal_iterator<const_glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
        ::operator++(&local_a0,0);
      }
      std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
      ~vector((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_> *)
              local_68);
    }
  }
  return;
}

Assistant:

void TessellationShaderInvarianceRule6Test::initTestIterations()
{
	DE_ASSERT(m_test_quads_iterations.size() == 0 && m_test_triangles_iterations.size() == 0);

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value */
	const glw::Functions& gl						  = m_context.getRenderContext().getFunctions();
	glw::GLint			  gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	/* Iterate through all primitive and vertex spacing modes relevant to the test */
	_tessellation_primitive_mode primitive_modes[] = { TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,
													   TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS };
	_tessellation_shader_vertex_ordering vertex_ordering_modes[] = { TESSELLATION_SHADER_VERTEX_ORDERING_CCW,
																	 TESSELLATION_SHADER_VERTEX_ORDERING_CW };

	const unsigned int n_primitive_modes = sizeof(primitive_modes) / sizeof(primitive_modes[0]);
	const unsigned int n_vo_modes		 = sizeof(vertex_ordering_modes) / sizeof(vertex_ordering_modes[0]);

	for (unsigned int n_primitive_mode = 0; n_primitive_mode < n_primitive_modes; ++n_primitive_mode)
	{
		_tessellation_primitive_mode primitive_mode = primitive_modes[n_primitive_mode];

		for (unsigned int n_vo_mode = 0; n_vo_mode < n_vo_modes; ++n_vo_mode)
		{
			_tessellation_shader_vertex_ordering vertex_ordering = vertex_ordering_modes[n_vo_mode];

			/* Retrieve inner/outer tessellation level combinations we want the tests to be run for.
			 * Since each level set we will be provided by getTessellationLevelSetForPrimitiveMode()
			 * is unique and does not repeat, we'll just make sure the inner level values are set to
			 * the same set of values, so that the conditions the test must meet are actually met.
			 */
			float*					 inner_levels_to_use = DE_NULL;
			_tessellation_levels_set levels_set;
			unsigned int			 n_levels_sets = 0;

			levels_set = TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode(
				primitive_mode, gl_max_tess_gen_level_value,
				TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);

			n_levels_sets		= (unsigned int)levels_set.size();
			inner_levels_to_use = levels_set[n_levels_sets - 1].inner;

			for (unsigned int n_levels_set = 0; n_levels_set < n_levels_sets - 1; n_levels_set++)
			{
				/* Make sure the Utils function was not changed and that inner level values
				 * are actually unique across the whole set */
				DE_ASSERT(levels_set[n_levels_set].inner[0] != levels_set[n_levels_sets - 1].inner[0] &&
						  levels_set[n_levels_set].inner[1] != levels_set[n_levels_sets - 1].inner[1]);

				/* Force the last set's inner values to all level combinations we'll be using */
				memcpy(levels_set[n_levels_set].inner, inner_levels_to_use, sizeof(levels_set[n_levels_set].inner));
			} /* for (all sets retrieved from Utils function */

			for (_tessellation_levels_set_const_iterator set_iterator = levels_set.begin();
				 set_iterator != levels_set.end(); set_iterator++)
			{
				const _tessellation_levels& levels = *set_iterator;

				/* Create a test descriptor for all the parameters we now have */
				_test_iteration test;

				memcpy(test.inner_tess_levels, levels.inner, sizeof(test.inner_tess_levels));
				memcpy(test.outer_tess_levels, levels.outer, sizeof(test.outer_tess_levels));

				test.primitive_mode  = primitive_mode;
				test.vertex_ordering = vertex_ordering;

				if (primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES)
				{
					m_test_triangles_iterations.push_back(test);
				}
				else
				{
					m_test_quads_iterations.push_back(test);
				}
			} /* for (all level sets) */
		}	 /* for (all vertex ordering modes) */
	}		  /* for (all primitive modes) */
}